

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.c
# Opt level: O0

int gb_add_hl(uint16_t value,Cpu *cpu)

{
  _Bool _Var1;
  uint16_t a;
  uint8_t *flags_00;
  uint16_t hl;
  uint8_t *flags;
  Cpu *cpu_local;
  uint16_t value_local;
  
  flags_00 = cpu->registers + 5;
  a = combine_bytes(cpu->registers[6],cpu->registers[7]);
  _Var1 = overflows_16bit(a,value);
  if (_Var1) {
    set_flag(flags_00,Flag_Carry);
  }
  else {
    clear_flag(flags_00,Flag_Carry);
  }
  _Var1 = half_carry_16bit(a,value);
  if (_Var1) {
    set_flag(flags_00,Flag_Half_Carry);
  }
  else {
    clear_flag(flags_00,Flag_Half_Carry);
  }
  clear_flag(flags_00,Flag_Sub);
  cpu->registers[6] = (uint8_t)((ushort)(a + value) >> 8);
  cpu->registers[7] = (uint8_t)(a + value);
  return 8;
}

Assistant:

int gb_add_hl(uint16_t value, Cpu* cpu) {
    
    uint8_t* flags = &(cpu->registers[Register_F]);
    uint16_t hl = combine_bytes(cpu->registers[Register_H], cpu->registers[Register_L]);

    overflows_16bit(hl, value) ? set_flag(flags, Flag_Carry) : clear_flag(flags, Flag_Carry);

    half_carry_16bit(hl, value) ? set_flag(flags, Flag_Half_Carry) : clear_flag(flags, Flag_Half_Carry);

    hl = (uint16_t) (hl + value);

    clear_flag(flags, Flag_Sub);

    cpu->registers[Register_H] =  (uint8_t)(hl >> 8u);
    cpu->registers[Register_L] =  (uint8_t)(hl & 0xFFu);

    return 8;
}